

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

bstrList * bsplits(bstring str,bstring splitStr)

{
  int iVar1;
  genBstrList g;
  bstring local_30;
  bstrList *local_28;
  undefined4 local_20;
  
  if (str == (bstring)0x0) {
    return (bstrList *)0x0;
  }
  if (-1 < str->slen) {
    if (splitStr == (bstring)0x0) {
      return (bstrList *)0x0;
    }
    if (str->data == (uchar *)0x0) {
      return (bstrList *)0x0;
    }
    if ((-1 < splitStr->slen) && (splitStr->data != (uchar *)0x0)) {
      local_20 = 4;
      local_28 = (bstrList *)malloc(0x28);
      if (local_28 != (bstrList *)0x0) {
        local_28->qty = 0;
        local_30 = str;
        iVar1 = bsplitscb(str,splitStr,0,bscb,&local_30);
        if (-1 < iVar1) {
          return local_28;
        }
        bstrListDestroy(local_28);
      }
    }
  }
  return (bstrList *)0x0;
}

Assistant:

struct bstrList * bsplits (const bstring str, const bstring splitStr) {
struct genBstrList g;

	if (     str == NULL ||      str->slen < 0 ||      str->data == NULL ||
	    splitStr == NULL || splitStr->slen < 0 || splitStr->data == NULL)
		return NULL;

	g.mlen = 4;
	g.bl = (struct bstrList *) bstr__alloc (BLE_SZ + sizeof (bstring) * g.mlen);
	if (g.bl == NULL) return NULL;
	g.b = str;
	g.bl->qty = 0;
	if (bsplitscb (str, splitStr, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}